

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O3

void find_cut(void)

{
  int *piVar1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var2;
  pointer piVar3;
  long lVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  longlong lVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  long *plVar9;
  pointer pvVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  pair<int,_int> pVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  _TmpBuf __buf;
  _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::pair<int,_int>_>
  local_88;
  int local_64;
  ulong local_60;
  long local_58;
  pair<int,_int> *local_50;
  ulong local_48;
  ulong local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_38;
  
  freopen("cut_min.txt","w",_stdout);
  local_88._M_original_len._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::dis,(long)V * 2,
             (value_type_conflict *)&local_88);
  local_88._M_original_len = (ulong)local_88._M_original_len._4_4_ << 0x20;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::ptr,(long)V * 2,
             (value_type_conflict *)&local_88);
  local_88._M_original_len._0_4_ = 0;
  local_88._M_original_len._4_4_ = 0;
  local_88._M_len = 0;
  local_88._M_buffer = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&(anonymous_namespace)::edges_dup,(long)V * 2,(value_type *)&local_88);
  if ((pair<int,_int>)local_88._M_original_len != (pair<int,_int>)0x0) {
    operator_delete((void *)local_88._M_original_len);
  }
  iVar12 = 100;
  if (V < 100) {
    iVar12 = V;
  }
  local_60 = CONCAT44(local_60._4_4_,iVar12);
  local_64 = V;
  if (0 < V) {
    pVar14.first = 0;
    pVar14.second = 0;
    lVar13 = 0;
    do {
      local_88._M_original_len = (size_type_conflict)pVar14;
      if (DAT_00119260._M_current == DAT_00119268) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &(anonymous_namespace)::top_flow,DAT_00119260,(pair<int,_int> *)&local_88);
      }
      else {
        *DAT_00119260._M_current = pVar14;
        DAT_00119260._M_current = DAT_00119260._M_current + 1;
      }
      lVar13 = lVar13 + 1;
      pVar14 = (pair<int,_int>)((long)pVar14 + 0x100000000);
    } while (lVar13 < V);
    if (0 < V) {
      lVar13 = 0;
      do {
        iVar12 = (int)lVar13;
        local_88._M_original_len._4_4_ = iVar12;
        local_88._M_original_len._0_4_ =
             (int)((ulong)((long)edge.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)edge.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        if (DAT_00119248._M_current == DAT_00119250) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     &(anonymous_namespace)::top_degree,DAT_00119248,(pair<int,_int> *)&local_88);
        }
        else {
          *DAT_00119248._M_current = (pair<int,_int>)local_88._M_original_len;
          DAT_00119248._M_current = DAT_00119248._M_current + 1;
        }
        piVar3 = edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar13].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (edge.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar13].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            != piVar3) {
          uVar17 = 0;
          do {
            dinic_addedge(iVar12,piVar3[uVar17] + V,V);
            uVar17 = uVar17 + 1;
            piVar3 = edge.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar13].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
          } while (uVar17 < (ulong)((long)edge.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
        }
        dinic_addedge(V + iVar12,iVar12,1);
        lVar13 = lVar13 + 1;
      } while (lVar13 < V);
    }
  }
  _Var2._M_current = DAT_00119248._M_current;
  lVar13 = (anonymous_namespace)::top_degree;
  if ((long)DAT_00119248._M_current - (anonymous_namespace)::top_degree != 0) {
    local_38.current._M_current =
         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            )DAT_00119248._M_current;
    lVar4 = (long)DAT_00119248._M_current - (anonymous_namespace)::top_degree >> 3;
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::pair<int,_int>_>
    ::_Temporary_buffer(&local_88,&local_38,(lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
    if (local_88._M_buffer == (pointer)0x0) {
      local_50 = _Var2._M_current;
      local_58 = lVar13;
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    else {
      local_50 = _Var2._M_current;
      local_58 = lVar13;
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    operator_delete(local_88._M_buffer);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Minimum cut between characters:",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar17 = local_60 & 0xffffffff;
  if (0 < local_64) {
    local_48 = 1;
    uVar16 = 0;
    local_60 = uVar17;
    do {
      local_40 = uVar16 + 1;
      pvVar10 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = local_48;
      if (local_40 < uVar17) {
        do {
          iVar12 = *(int *)((anonymous_namespace)::top_degree + 4 + uVar16 * 8);
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (pvVar10[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             pvVar10[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             (anonymous_namespace)::top_degree + uVar15 * 8 + 4);
          iVar12 = *(int *)((anonymous_namespace)::top_degree + 4 + uVar16 * 8);
          pvVar10 = edge.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (_Var5._M_current ==
              edge.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar12].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            lVar6 = dinic_flow(iVar12,V + *(int *)((anonymous_namespace)::top_degree + 4 +
                                                  uVar15 * 8));
            pmVar7 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&name_abi_cxx11_,
                                  (key_type *)((anonymous_namespace)::top_degree + uVar16 * 8 + 4));
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(pmVar7->_M_dataplus)._M_p,
                                pmVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," -> ",4);
            pmVar7 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&name_abi_cxx11_,
                                  (key_type *)((anonymous_namespace)::top_degree + uVar15 * 8 + 4));
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
            plVar9 = (long *)std::ostream::operator<<(poVar8,(int)lVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            pvVar10 = edge.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar13 = (anonymous_namespace)::top_flow;
            uVar17 = local_60;
            if (DAT_001192a8 - (anonymous_namespace)::edgelist != 0) {
              lVar4 = DAT_001192a8 - (anonymous_namespace)::edgelist >> 4;
              lVar4 = lVar4 + (ulong)(lVar4 == 0);
              piVar11 = (int *)((anonymous_namespace)::edgelist + 0xc);
              do {
                if ((piVar11[-3] == V + piVar11[-2]) && (*piVar11 == 1)) {
                  piVar1 = (int *)(lVar13 + (long)piVar11[-2] * 8);
                  *piVar1 = *piVar1 + 1;
                }
                *piVar11 = 0;
                piVar11 = piVar11 + 4;
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar17);
      }
      local_48 = local_48 + 1;
      uVar16 = local_40;
    } while (local_40 != uVar17);
  }
  _Var2._M_current = DAT_00119260._M_current;
  lVar13 = (anonymous_namespace)::top_flow;
  if ((long)DAT_00119260._M_current - (anonymous_namespace)::top_flow != 0) {
    local_38.current._M_current =
         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            )DAT_00119260._M_current;
    lVar4 = (long)DAT_00119260._M_current - (anonymous_namespace)::top_flow >> 3;
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::pair<int,_int>_>
    ::_Temporary_buffer(&local_88,&local_38,(lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
    if (local_88._M_buffer == (pointer)0x0) {
      local_50 = _Var2._M_current;
      local_58 = lVar13;
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    else {
      local_50 = _Var2._M_current;
      local_58 = lVar13;
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    operator_delete(local_88._M_buffer);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"Top involved characters in the flows:",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (0 < local_64) {
    lVar13 = 0;
    do {
      pmVar7 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,
                            (key_type *)((anonymous_namespace)::top_flow + lVar13 + 4));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
      poVar8 = (ostream *)
               std::ostream::operator<<(poVar8,*(int *)((anonymous_namespace)::top_flow + lVar13));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      lVar13 = lVar13 + 8;
    } while (uVar17 * 8 != lVar13);
  }
  return;
}

Assistant:

void find_cut() {
    freopen("cut_min.txt", "w", stdout); // output file
    
    dis.resize(2 * V, 0);
    ptr.resize(2 * V, 0);
    edges_dup.resize(2 * V, vector<int>(0));
    const int top = min(100, V);

    for (int i = 0; i < V; i++)
        top_flow.push_back(make_pair(0, i));

    for (int i = 0; i < V; i++) {
        top_degree.push_back(make_pair(edge[i].size(), i));
        for (int j = 0; j < edge[i].size(); j++) {
            int to = edge[i][j];
            dinic_addedge(i, to + V, V);
        }
        dinic_addedge(i + V, i, 1);
    }
    
    stable_sort(top_degree.rbegin(), top_degree.rend());
    
    cout << "Minimum cut between characters:" << endl;
    for (int i = 0; i < top; i++) {
        for (int j = i + 1; j < top; j++) {
            vector<int>::iterator p = find(edge[top_degree[i].second].begin(), edge[top_degree[i].second].end(), top_degree[j].second);
            
            if (p != edge[top_degree[i].second].end())
                continue;
            
            int flow = dinic_flow(top_degree[i].second, top_degree[j].second + V);
            cout << name[top_degree[i].second] << " -> " << name[top_degree[j].second] << " = " << flow << endl;     

            for (int k = 0; k < edgelist.size(); k++) {
                if ((edgelist[k].a == (edgelist[k].b + V)) && (edgelist[k].flow == 1)) {
                    top_flow[edgelist[k].b].first++;
                }
                edgelist[k].flow = 0;
            }
        }
    }
    
    stable_sort(top_flow.rbegin(), top_flow.rend());

    cout << endl << "Top involved characters in the flows:" << endl;
    for (int i = 0; i < top; i++) {
        cout << name[top_flow[i].second] << " (" << top_flow[i].first << ")" << endl;
    }
}